

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfcFlash.cpp
# Opt level: O0

void __thiscall EfcFlash::writePage(EfcFlash *this,uint32_t page)

{
  FlashPageError *this_00;
  uint32_t local_44;
  uint32_t page_local;
  EfcFlash *this_local;
  
  if ((this->super_Flash)._pages <= page) {
    this_00 = (FlashPageError *)__cxa_allocate_exception(8);
    FlashPageError::FlashPageError(this_00);
    __cxa_throw(this_00,&FlashPageError::typeinfo,FlashPageError::~FlashPageError);
  }
  WordCopyApplet::setDstAddr
            (&(this->super_Flash)._wordCopy,
             (this->super_Flash)._addr + page * (this->super_Flash)._size);
  if (((this->super_Flash)._onBufferA & 1U) == 0) {
    local_44 = (this->super_Flash)._pageBufferB;
  }
  else {
    local_44 = (this->super_Flash)._pageBufferA;
  }
  WordCopyApplet::setSrcAddr(&(this->super_Flash)._wordCopy,local_44);
  (this->super_Flash)._onBufferA = (bool)(((this->super_Flash)._onBufferA ^ 0xffU) & 1);
  waitFSR(this,1);
  Applet::run(&(this->super_Flash)._wordCopy.super_Applet);
  if (((this->super_Flash)._planes == 2) && ((this->super_Flash)._pages >> 1 <= page)) {
    writeFCR1(this,'\x01',page - ((this->super_Flash)._pages >> 1));
  }
  else {
    writeFCR0(this,'\x01',page);
  }
  return;
}

Assistant:

void
EfcFlash::writePage(uint32_t page)
{
    if (page >= _pages)
        throw FlashPageError();

    _wordCopy.setDstAddr(_addr + page * _size);
    _wordCopy.setSrcAddr(_onBufferA ? _pageBufferA : _pageBufferB);
    _onBufferA = !_onBufferA;
    waitFSR();
    _wordCopy.run();
    if (_planes == 2 && page >= _pages / 2)
        writeFCR1(EFC_FCMD_WP, page - _pages / 2);
    else
        writeFCR0(EFC_FCMD_WP, page);
}